

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O0

int32_t MyGame_Example_FooBar_bar_get(MyGame_Example_FooBar_struct_t t__tmp,size_t i__tmp)

{
  size_t i__tmp_local;
  MyGame_Example_FooBar_struct_t t__tmp_local;
  
  if ((t__tmp == (MyGame_Example_FooBar_struct_t)0x0) || (9 < i__tmp)) {
    t__tmp_local._4_4_ = 0;
  }
  else {
    t__tmp_local._4_4_ = flatbuffers_int32_read_from_pe(t__tmp->bar + i__tmp);
  }
  return t__tmp_local._4_4_;
}

Assistant:

__flatbuffers_define_struct_scalar_fixed_array_field(MyGame_Example_FooBar, foo, flatbuffers_float, float, 16)
__flatbuffers_define_struct_scalar_fixed_array_field(MyGame_Example_FooBar, bar, flatbuffers_int32, int32_t, 10)
__flatbuffers_define_struct_scalar_fixed_array_field(MyGame_Example_FooBar, col, MyGame_Example_Color, MyGame_Example_Color_enum_t, 3)
__flatbuffers_define_struct_struct_fixed_array_field(MyGame_Example_FooBar, tests, MyGame_Example_Test_struct_t, 2)
__flatbuffers_define_struct_scalar_fixed_array_field(MyGame_Example_FooBar, text, flatbuffers_char, char, 5)

struct Fantasy_Rapunzel {
    alignas(4) uint16_t hair_length;
    alignas(4) uint8_t __deprecated0[4]; /* was: 'travel_points' */
};
static_assert(sizeof(Fantasy_Rapunzel_t) == 8, "struct size mismatch");

static inline const Fantasy_Rapunzel_t *Fantasy_Rapunzel__const_ptr_add(const Fantasy_Rapunzel_t *p, size_t i) { return p + i; }
static inline Fantasy_Rapunzel_t *Fantasy_Rapunzel__ptr_add(Fantasy_Rapunzel_t *p, size_t i) { return p + i; }
static inline Fantasy_Rapunzel_struct_t Fantasy_Rapunzel_vec_at(Fantasy_Rapunzel_vec_t vec, size_t i)
__flatbuffers_struct_vec_at(vec, i)
static inline size_t Fantasy_Rapunzel__size(void) { return 8; }
static inline size_t Fantasy_Rapunzel_vec_len(Fantasy_Rapunzel_vec_t vec)
__flatbuffers_vec_len(vec)
__flatbuffers_struct_as_root(Fantasy_Rapunzel)

__flatbuffers_define_struct_scalar_field(Fantasy_Rapunzel, hair_length, flatbuffers_uint16, uint16_t)
/* Note: find only works on vectors sorted by this field. */
__flatbuffers_define_find_by_scalar_field(Fantasy_Rapunzel, hair_length, uint16_t)
__flatbuffers_define_struct_sort_by_scalar_field(Fantasy_Rapunzel, hair_length, uint16_t, Fantasy_Rapunzel_t)
__flatbuffers_define_default_find_by_scalar_field(Fantasy_Rapunzel, hair_length, uint16_t)
__flatbuffers_define_default_scan_by_scalar_field(Fantasy_Rapunzel, hair_length, uint16_t)
#define Fantasy_Rapunzel_vec_sort Fantasy_Rapunzel_vec_sort_by_hair_length

struct Fantasy_BookReader {
    alignas(4) int32_t books_read;
};
static_assert(sizeof(Fantasy_BookReader_t) == 4, "struct size mismatch");

static inline const Fantasy_BookReader_t *Fantasy_BookReader__const_ptr_add(const Fantasy_BookReader_t *p, size_t i) { return p + i; }